

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnTlatedAddPalCommand::Execute
          (DrawColumnTlatedAddPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int pitch_00;
  uchar *dest_00;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  uint uVar9;
  uint32_t bg;
  uint32_t fg;
  uint8_t *source;
  uint8_t *colormap;
  uint8_t *translation;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int pitch;
  fixed_t fracstep;
  fixed_t frac;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawColumnTlatedAddPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  iVar1 = (this->super_PalColumnCommand)._iscale;
  iVar2 = (this->super_PalColumnCommand)._texturefrac;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    pitch_00 = (this->super_PalColumnCommand)._pitch;
    _fracstep = DrawerThread::dest_for_thread<unsigned_char>
                          (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                           pitch_00,dest_00);
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pitch = iVar1 * iVar8 + iVar2;
    iVar2 = thread->num_cores;
    iVar8 = thread->num_cores;
    puVar3 = (this->super_PalColumnCommand)._srcblend;
    puVar4 = (this->super_PalColumnCommand)._destblend;
    puVar5 = (this->super_PalColumnCommand)._translation;
    puVar6 = (this->super_PalColumnCommand)._colormap;
    puVar7 = (this->super_PalColumnCommand)._source;
    do {
      uVar9 = puVar3[puVar6[puVar5[puVar7[pitch >> 0x10]]]] + puVar4[*_fracstep] | 0x1f07c1f;
      *_fracstep = RGB32k.All[uVar9 & uVar9 >> 0xf];
      _fracstep = _fracstep + iVar8 * pitch_00;
      pitch = iVar2 * iVar1 + pitch;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawColumnTlatedAddPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;
		const uint8_t *translation = _translation;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;

		do
		{
			uint32_t fg = colormap[translation[source[frac >> FRACBITS]]];
			uint32_t bg = *dest;

			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg + bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg >> 15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}